

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O0

void __thiscall
stk::FileWrite::FileWrite
          (FileWrite *this,string *fileName,uint nChannels,FILE_TYPE type,StkFormat format)

{
  string local_50 [32];
  StkFormat local_30;
  StkFormat format_local;
  FILE_TYPE type_local;
  string *psStack_18;
  uint nChannels_local;
  string *fileName_local;
  FileWrite *this_local;
  
  local_30 = format;
  format_local = type;
  type_local._4_4_ = nChannels;
  psStack_18 = fileName;
  fileName_local = (string *)this;
  Stk::Stk(&this->super_Stk);
  (this->super_Stk)._vptr_Stk = (_func_int **)&PTR__FileWrite_00123d20;
  this->fd_ = (FILE *)0x0;
  std::__cxx11::string::string(local_50,(string *)fileName);
  open(this,(char *)local_50,type_local._4_4_,format_local,local_30);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

FileWrite::FileWrite( std::string fileName, unsigned int nChannels, FILE_TYPE type, Stk::StkFormat format )
  : fd_( 0 )
{
  this->open( fileName, nChannels, type, format );
}